

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_twod_brick_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_INT dim)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  REF_INT cell;
  REF_INT edg [3];
  REF_INT tri [4];
  REF_INT node;
  REF_INT local_90;
  int local_8c;
  int local_88;
  undefined4 local_84;
  ulong local_80;
  REF_GRID_conflict local_78;
  REF_DBL local_70;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  ulong local_50;
  double local_48;
  int local_3c;
  REF_NODE local_38;
  
  uVar14 = (ulong)(uint)dim;
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    pRVar1->twod = 1;
    if (pRVar1->mpi->id == 0) {
      iVar6 = dim + -1;
      local_80 = uVar14;
      local_78 = pRVar1;
      if (0 < dim) {
        local_48 = 1.0 / (double)iVar6;
        lVar10 = 0;
        uVar5 = 0;
        do {
          local_70 = (double)(int)uVar5 * local_48 + 0.0;
          uVar15 = 0;
          local_50 = uVar5;
          do {
            uVar3 = ref_node_add(ref_node,lVar10 + uVar15,&local_3c);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x74f,"ref_fixture_twod_brick_grid",(ulong)uVar3,"node");
              return uVar3;
            }
            pRVar2 = ref_node->real;
            lVar7 = (long)local_3c;
            pRVar2[lVar7 * 0xf] = (double)(int)uVar15 * local_48 + 0.0;
            pRVar2[lVar7 * 0xf + 1] = local_70;
            pRVar2[lVar7 * 0xf + 2] = 0.0;
            uVar15 = uVar15 + 1;
          } while (uVar14 != uVar15);
          uVar5 = local_50 + 1;
          lVar10 = lVar10 + uVar14;
        } while (uVar5 != uVar14);
      }
      local_84 = 1;
      iVar12 = 0;
      if (0 < iVar6) {
        iVar12 = iVar6;
      }
      iVar13 = 0;
      local_38 = ref_node;
      while (iVar12 != iVar13) {
        local_8c = iVar13;
        local_88 = iVar13 + 1;
        uVar3 = ref_cell_add(local_78->cell[0],&local_8c,&local_90);
        iVar13 = iVar13 + 1;
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x75b,"ref_fixture_twod_brick_grid",(ulong)uVar3,"qua");
          return uVar3;
        }
      }
      local_84 = 2;
      iVar12 = iVar12 + 1;
      iVar9 = (int)local_80 * 2 + -1;
      uVar3 = 0;
      iVar13 = iVar6;
      while (iVar12 = iVar12 + -1, iVar12 != 0) {
        local_8c = iVar13;
        local_88 = iVar9;
        uVar4 = ref_cell_add(local_78->cell[0],&local_8c,&local_90);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x763,"ref_fixture_twod_brick_grid",(ulong)uVar4,"edg");
          uVar3 = uVar4;
        }
        iVar13 = iVar13 + (int)local_80;
        iVar9 = iVar9 + (int)local_80;
        if (uVar4 != 0) {
          return uVar3;
        }
      }
      local_84 = 3;
      iVar12 = (int)local_80;
      if (1 < iVar12) {
        iVar13 = iVar12 * iVar12 + -2;
        iVar12 = iVar6;
        do {
          local_8c = iVar13 + 1;
          local_88 = iVar13;
          uVar3 = ref_cell_add(local_78->cell[0],&local_8c,&local_90);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x76b,"ref_fixture_twod_brick_grid",(ulong)uVar3,"edg");
            return uVar3;
          }
          iVar12 = iVar12 + -1;
          iVar13 = iVar13 + -1;
        } while (0 < iVar12);
      }
      local_84 = 4;
      iVar12 = (int)local_80;
      if (1 < iVar12) {
        iVar9 = (iVar12 + -2) * iVar12;
        iVar12 = iVar12 * iVar6;
        iVar13 = iVar6;
        do {
          local_8c = iVar12;
          local_88 = iVar9;
          uVar3 = ref_cell_add(local_78->cell[0],&local_8c,&local_90);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x773,"ref_fixture_twod_brick_grid",(ulong)uVar3,"edg");
            return uVar3;
          }
          iVar13 = iVar13 + -1;
          iVar9 = iVar9 - (int)local_80;
          iVar12 = iVar12 - (int)local_80;
        } while (0 < iVar13);
      }
      local_5c = 1;
      iVar12 = (int)local_80;
      if (1 < iVar12) {
        local_48 = (double)(ulong)(iVar12 + 1);
        iVar13 = 0;
        local_70 = (REF_DBL)((ulong)local_70 & 0xffffffff00000000);
        do {
          local_50 = CONCAT44(local_50._4_4_,iVar13);
          iVar12 = iVar6;
          while (bVar16 = iVar12 != 0, iVar12 = iVar12 + -1, bVar16) {
            iVar9 = SUB84(local_48,0) + iVar13;
            local_68 = iVar13;
            local_64 = iVar13 + 1;
            local_60 = iVar9;
            uVar3 = ref_cell_add(local_78->cell[3],&local_68,&local_90);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x77d,"ref_fixture_twod_brick_grid",(ulong)uVar3,"tri");
              return uVar3;
            }
            local_60 = iVar13 + (int)local_80;
            local_68 = iVar13;
            local_64 = iVar9;
            uVar3 = ref_cell_add(local_78->cell[3],&local_68,&local_90);
            iVar13 = iVar13 + 1;
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x781,"ref_fixture_twod_brick_grid",(ulong)uVar3,"tri");
              return uVar3;
            }
          }
          iVar9 = local_70._0_4_ + 1;
          iVar12 = (int)local_80;
          iVar13 = (int)local_50 + iVar12;
          local_70 = (REF_DBL)CONCAT44(local_70._4_4_,iVar9);
        } while (iVar9 != iVar6);
      }
      uVar3 = ref_node_initialize_n_global(local_38,(ulong)(uint)(iVar12 * iVar12));
      if (uVar3 == 0) {
        return 0;
      }
      pcVar11 = "init glob";
      uVar8 = 0x785;
    }
    else {
      uVar3 = ref_node_initialize_n_global(ref_node,(ulong)(uint)(dim * dim));
      if (uVar3 == 0) {
        return 0;
      }
      pcVar11 = "init glob";
      uVar8 = 0x73d;
    }
  }
  else {
    pcVar11 = "create";
    uVar8 = 0x736;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_twod_brick_grid",(ulong)uVar3,pcVar11);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_brick_grid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi, REF_INT dim) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, cell;
  REF_INT edg[3], tri[4];

  REF_INT m, n;
  REF_INT i, j;

  REF_DBL x0 = 0.0;
  REF_DBL x1 = 1.0;

  REF_DBL y0 = 0.0;
  REF_DBL y1 = 1.0;

  REF_DBL z = 0.0;

  REF_DBL dx, dy;

  m = dim;
  n = dim;

  dx = (x1 - x0) / ((REF_DBL)(n - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");
    return REF_SUCCESS;
  }

  /*
  y   3 --- 2
  ^   |     |
  |   |     |
  |   0 --- 1
  |
  +----> x
  */

#define ij2node(i, j, m, n) ((i) + (j) * (m))

  for (j = 0; j < n; j++) {
    for (i = 0; i < m; i++) {
      global = ij2node(i, j, m, n);
      RSS(ref_node_add(ref_node, global, &node), "node");
      ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
      ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
      ref_node_xyz(ref_node, 2, node) = z;
    }
  }

  edg[2] = 1;
  j = 0;
  for (i = 0; i < m - 1; i++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i + 1, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "qua");
  }

  edg[2] = 2;
  i = m - 1;
  for (j = 0; j < n - 1; j++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i, j + 1, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 3;
  j = n - 1;
  for (i = m - 2; i >= 0; i--) {
    edg[0] = ij2node(i + 1, j, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 4;
  i = 0;
  for (j = n - 2; j >= 0; j--) {
    edg[0] = ij2node(i, j + 1, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  tri[3] = 1;
  j = 1;
  for (j = 0; j < n - 1; j++) {
    for (i = 0; i < m - 1; i++) {
      tri[0] = ij2node(i, j, m, n);
      tri[1] = ij2node(i + 1, j, m, n);
      tri[2] = ij2node(i + 1, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = ij2node(i, j, m, n);
      tri[1] = ij2node(i + 1, j + 1, m, n);
      tri[2] = ij2node(i, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }
  }

  RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");

  return REF_SUCCESS;
}